

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O1

aiMesh * __thiscall Assimp::IFC::TempMesh::ToMesh(TempMesh *this)

{
  double dVar1;
  uint uVar2;
  pointer paVar3;
  pointer paVar4;
  ulong uVar5;
  aiMesh *paVar6;
  aiVector3D *__s;
  long lVar7;
  ulong *puVar8;
  aiFace *paVar9;
  uint *puVar10;
  aiFace *paVar11;
  ulong uVar12;
  uint *puVar13;
  long lVar14;
  ulong uVar15;
  pointer __p;
  _Head_base<0UL,_aiMesh_*,_false> _Var16;
  int iVar17;
  uint uVar18;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  _Head_base<0UL,_aiMesh_*,_false> local_58;
  char *local_50;
  aiVector3D **local_48;
  ulong local_40;
  uint *local_38;
  
  paVar3 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar4 = (this->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40 = (long)paVar4 - (long)paVar3;
  uVar15 = ((long)local_40 / 6 + ((long)local_40 >> 0x3f) >> 2) - ((long)local_40 >> 0x3f);
  puVar10 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish;
  uVar5 = 0;
  local_38 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (puVar13 = local_38; puVar13 != puVar10; puVar13 = puVar13 + 1) {
    uVar5 = uVar5 + *puVar13;
  }
  if (uVar15 == uVar5) {
    _Var16._M_head_impl = (aiMesh *)0x0;
    if (paVar3 != paVar4) {
      paVar6 = (aiMesh *)operator_new(0x520);
      paVar6->mPrimitiveTypes = 0;
      paVar6->mNumVertices = 0;
      paVar6->mNumFaces = 0;
      local_48 = &paVar6->mVertices;
      local_50 = (paVar6->mName).data + 1;
      memset(local_48,0,0xcc);
      paVar6->mBones = (aiBone **)0x0;
      paVar6->mMaterialIndex = 0;
      (paVar6->mName).length = 0;
      (paVar6->mName).data[0] = '\0';
      memset(local_50,0x1b,0x3ff);
      paVar6->mNumAnimMeshes = 0;
      paVar6->mAnimMeshes = (aiAnimMesh **)0x0;
      paVar6->mMethod = 0;
      (paVar6->mAABB).mMin.x = 0.0;
      (paVar6->mAABB).mMin.y = 0.0;
      (paVar6->mAABB).mMin.z = 0.0;
      (paVar6->mAABB).mMax.x = 0.0;
      (paVar6->mAABB).mMax.y = 0.0;
      (paVar6->mAABB).mMax.z = 0.0;
      paVar6->mTextureCoords[0] = (aiVector3D *)0x0;
      paVar6->mTextureCoords[1] = (aiVector3D *)0x0;
      paVar6->mTextureCoords[2] = (aiVector3D *)0x0;
      paVar6->mTextureCoords[3] = (aiVector3D *)0x0;
      paVar6->mTextureCoords[4] = (aiVector3D *)0x0;
      paVar6->mTextureCoords[5] = (aiVector3D *)0x0;
      paVar6->mTextureCoords[6] = (aiVector3D *)0x0;
      paVar6->mTextureCoords[7] = (aiVector3D *)0x0;
      paVar6->mNumUVComponents[0] = 0;
      paVar6->mNumUVComponents[1] = 0;
      paVar6->mNumUVComponents[2] = 0;
      paVar6->mNumUVComponents[3] = 0;
      paVar6->mNumUVComponents[4] = 0;
      paVar6->mNumUVComponents[5] = 0;
      paVar6->mNumUVComponents[6] = 0;
      paVar6->mNumUVComponents[7] = 0;
      paVar6->mColors[0] = (aiColor4D *)0x0;
      paVar6->mColors[1] = (aiColor4D *)0x0;
      paVar6->mColors[2] = (aiColor4D *)0x0;
      paVar6->mColors[3] = (aiColor4D *)0x0;
      paVar6->mColors[4] = (aiColor4D *)0x0;
      paVar6->mColors[5] = (aiColor4D *)0x0;
      paVar6->mColors[6] = (aiColor4D *)0x0;
      paVar6->mColors[7] = (aiColor4D *)0x0;
      paVar6->mNumVertices = (uint)uVar15;
      local_50 = (char *)(uVar15 & 0xffffffff);
      local_58._M_head_impl = paVar6;
      __s = (aiVector3D *)operator_new__((long)local_50 * 0xc);
      if ((uint)uVar15 != 0) {
        memset(__s,0,(((long)local_50 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
      }
      *local_48 = __s;
      if (0 < (long)local_40) {
        lVar14 = local_40 / 0x18 + 1;
        lVar7 = 0;
        do {
          dVar1 = *(double *)((long)&paVar3->z + lVar7 * 2);
          *(ulong *)((long)&__s->x + lVar7) =
               CONCAT44((float)*(double *)((long)&paVar3->y + lVar7 * 2),
                        (float)*(double *)((long)&paVar3->x + lVar7 * 2));
          *(float *)((long)&__s->z + lVar7) = (float)dVar1;
          lVar7 = lVar7 + 0xc;
          lVar14 = lVar14 + -1;
        } while (1 < lVar14);
      }
      uVar5 = (ulong)((long)puVar10 - (long)local_38) >> 2;
      uVar18 = (uint)uVar5;
      paVar6->mNumFaces = uVar18;
      uVar5 = uVar5 & 0xffffffff;
      puVar8 = (ulong *)operator_new__(uVar5 * 0x10 + 8);
      *puVar8 = uVar5;
      paVar9 = (aiFace *)(puVar8 + 1);
      if (uVar18 != 0) {
        paVar11 = paVar9;
        do {
          paVar11->mNumIndices = 0;
          paVar11->mIndices = (uint *)0x0;
          paVar11 = paVar11 + 1;
        } while (paVar11 != paVar9 + uVar5);
      }
      paVar6->mFaces = paVar9;
      uVar18 = (local_58._M_head_impl)->mNumFaces;
      _Var16._M_head_impl = local_58._M_head_impl;
      if (uVar18 != 0) {
        iVar17 = 0;
        uVar5 = 0;
        uVar15 = 0;
        do {
          uVar2 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar5];
          if ((ulong)uVar2 == 0) {
            (local_58._M_head_impl)->mNumFaces = uVar18 - 1;
          }
          else {
            paVar9 = (local_58._M_head_impl)->mFaces + uVar15;
            paVar9->mNumIndices = uVar2;
            puVar10 = (uint *)operator_new__((ulong)uVar2 << 2);
            paVar9->mIndices = puVar10;
            if (paVar9->mNumIndices != 0) {
              uVar12 = 0;
              do {
                paVar9->mIndices[uVar12] = iVar17 + (int)uVar12;
                uVar12 = uVar12 + 1;
              } while (uVar12 < paVar9->mNumIndices);
              iVar17 = iVar17 + (int)uVar12;
            }
            uVar15 = (ulong)((int)uVar15 + 1);
          }
          uVar5 = (ulong)((int)uVar5 + 1);
          uVar18 = (local_58._M_head_impl)->mNumFaces;
          _Var16._M_head_impl = local_58._M_head_impl;
        } while ((uint)uVar15 < uVar18);
      }
      local_58._M_head_impl = (aiMesh *)0x0;
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
                ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_58);
    }
    return _Var16._M_head_impl;
  }
  __assert_fail("mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCUtil.cpp"
                ,0x47,"aiMesh *Assimp::IFC::TempMesh::ToMesh()");
}

Assistant:

aiMesh* TempMesh::ToMesh()
{
    ai_assert(mVerts.size() == std::accumulate(mVertcnt.begin(),mVertcnt.end(),size_t(0)));

    if (mVerts.empty()) {
        return NULL;
    }

    std::unique_ptr<aiMesh> mesh(new aiMesh());

    // copy vertices
    mesh->mNumVertices = static_cast<unsigned int>(mVerts.size());
    mesh->mVertices = new aiVector3D[mesh->mNumVertices];
    std::copy(mVerts.begin(),mVerts.end(),mesh->mVertices);

    // and build up faces
    mesh->mNumFaces = static_cast<unsigned int>(mVertcnt.size());
    mesh->mFaces = new aiFace[mesh->mNumFaces];

    for(unsigned int i = 0,n=0, acc = 0; i < mesh->mNumFaces; ++n) {
        aiFace& f = mesh->mFaces[i];
        if (!mVertcnt[n]) {
            --mesh->mNumFaces;
            continue;
        }

        f.mNumIndices = mVertcnt[n];
        f.mIndices = new unsigned int[f.mNumIndices];
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            f.mIndices[a] = acc++;
        }

        ++i;
    }

    return mesh.release();
}